

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d_dump.c
# Opt level: O1

int s98d_dump(s98context *ctx)

{
  uint uVar1;
  uint8_t *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint8_t *p;
  byte *pbVar9;
  int s;
  int n;
  uint uVar10;
  byte *pbVar11;
  int local_34;
  
  set_offset(ctx,(ulong)(ctx->header).offset_to_dump);
  puVar2 = ctx->s98_buffer;
  uVar1 = (ctx->header).offset_to_loop;
  pbVar11 = puVar2 + ctx->s98_size;
  if (ctx->p < puVar2 + (ctx->header).offset_to_tag) {
    pbVar11 = puVar2 + (ctx->header).offset_to_tag;
  }
  uVar10 = 0xffffffff;
  local_34 = 0;
  do {
    while( true ) {
      while( true ) {
        if (ctx->p == puVar2 + uVar1) {
          puts("\n\n[");
          uVar10 = 0xffffffff;
        }
        bVar5 = read_byte(ctx);
        pbVar9 = ctx->p;
        if (pbVar11 < pbVar9) {
          return 0;
        }
        if ((char)bVar5 < '\0') break;
        bVar6 = read_byte(ctx);
        bVar7 = read_byte(ctx);
        if (uVar10 != bVar5) {
          local_34 = printf("\n%c ",(ulong)(uint)(int)(char)(bVar5 + 0x41));
          uVar10 = (uint)bVar5;
        }
        if (0x49 < local_34) {
          local_34 = printf("\n%c ",(ulong)(uVar10 + 0x41));
        }
        iVar8 = printf("%02x:%02x ",(ulong)bVar6,(ulong)bVar7);
        local_34 = local_34 + iVar8;
      }
      if (bVar5 != 0xff) break;
      printf("\n\n/");
      uVar10 = 1;
LAB_00101c13:
      step_timer(ctx,uVar10);
      lVar3 = (ctx->ts).tv_sec;
      iVar8 = (int)(lVar3 / 0x3c);
      auVar4 = SEXT816(lVar3 / 0x3c) * ZEXT816(0x8888888888888889);
      fprintf(_stdout,"\t; %d:%02d:%02d.%09d (sync %ld)",
              (ulong)(uint)((int)(SUB168(SEXT816(lVar3) * SEXT816(0x48d159e26af37c05),8) >> 10) -
                           (SUB164(SEXT816(lVar3) * SEXT816(0x48d159e26af37c05),0xc) >> 0x1f)),
              (ulong)(uint)(iVar8 + ((int)(auVar4._8_8_ >> 5) - (auVar4._12_4_ >> 0x1f)) * -0x3c),
              (ulong)(uint)((int)lVar3 + iVar8 * -0x3c),(ulong)(uint)(ctx->ts).tv_nsec,
              ctx->sync_count);
      putchar(10);
      uVar10 = 0xffffffff;
    }
    if (bVar5 == 0xfe) {
      if ((ctx->header).version == 1) {
        bVar5 = read_byte(ctx);
        uVar10 = (uint)bVar5;
      }
      else {
        bVar5 = 0;
        uVar10 = 0;
        do {
          bVar6 = *pbVar9;
          uVar10 = uVar10 | (bVar6 & 0x7f) << (bVar5 & 0x1f);
          bVar5 = bVar5 + 7;
          pbVar9 = pbVar9 + 1;
        } while ((char)bVar6 < '\0');
        ctx->p = pbVar9;
      }
      uVar10 = uVar10 + 2;
      printf("\n\n/ %d",(ulong)uVar10);
      goto LAB_00101c13;
    }
    if (bVar5 != 0xfd) {
      return 1;
    }
    puts("\n\n]");
    uVar10 = 0xffffffff;
  } while( true );
}

Assistant:

int s98d_dump(struct s98context* ctx)
{
    int ch;
    int current_ch = -1;
    int line_chars = 0;
    struct s98header* h = &ctx->header;
    uint8_t* tag_ptr;
    uint8_t* loop_ptr;
    uint8_t* end_ptr;

    set_offset(ctx, h->offset_to_dump);
    tag_ptr = ctx->s98_buffer + h->offset_to_tag;
    loop_ptr = ctx->s98_buffer + h->offset_to_loop;
    end_ptr = ctx->s98_buffer + ctx->s98_size;
    if(ctx->p < tag_ptr)
        end_ptr = tag_ptr;

    for(;;) {
        if(ctx->p == loop_ptr) {
            printf("\n\n[\n");
            current_ch = -1;
        }
        ch = read_byte(ctx);

        if(ctx->p > end_ptr) {
            // fprintf(stderr, "end of dump reached\n");
            break;
        }

        if(ch < 0x80) {
            uint8_t addr, value;
            // register write
            addr = read_byte(ctx);
            value = read_byte(ctx);

            if(current_ch != ch) {
                char part_name = ch + 'A';
                line_chars = printf("\n%c ", part_name);
                current_ch = ch;
            }
            if(line_chars + 6 >= 80) {
                line_chars = printf("\n%c ", current_ch + 'A');
            }
            line_chars += printf("%02x:%02x ", addr, value);
            continue;
        }
        switch(ch) {
        case 0xfd:
            printf("\n\n]\n");
            current_ch = -1;
            break;
        case 0xfe:
        {
            int times = 0;
            if(h->version == 1) {
                times = read_byte(ctx) + 2;
            } else {
                times = getvv(ctx);
            }
            printf("\n\n/ %d", times);
            step_timer(ctx, times);
            print_timestamp(ctx, stdout);
            putchar('\n');
            current_ch = -1;
            break;
        }
        case 0xff:
            printf("\n\n/");
            step_timer(ctx, 1);
            print_timestamp(ctx, stdout);
            putchar('\n');
            current_ch = -1;
            break;
        default:
            // 80-fc
            return 1;
        }
    }

    return 0;
}